

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

NTrodeObj * __thiscall
TrodesConfig::getNTrodeByID(NTrodeObj *__return_storage_ptr__,TrodesConfig *this,string *id)

{
  pointer pNVar1;
  pointer pcVar2;
  long *plVar3;
  int iVar4;
  pointer pNVar5;
  bool bVar6;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pNVar5 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar5 != pNVar1) {
    do {
      pcVar2 = (pNVar5->id)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (pNVar5->id)._M_string_length);
      plVar3 = local_50;
      if (local_48 == id->_M_string_length) {
        if (local_48 == 0) {
          bVar6 = true;
        }
        else {
          iVar4 = bcmp(local_50,(id->_M_dataplus)._M_p,local_48);
          bVar6 = iVar4 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (plVar3 != local_40) {
        operator_delete(plVar3,local_40[0] + 1);
      }
      if (bVar6) {
        (__return_storage_ptr__->super_NetworkDataType)._vptr_NetworkDataType =
             (_func_int **)&PTR__NTrodeObj_002e75b0;
        (__return_storage_ptr__->id)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->id).field_2;
        pcVar2 = (pNVar5->id)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->id,pcVar2,
                   pcVar2 + (pNVar5->id)._M_string_length);
        __return_storage_ptr__->index = pNVar5->index;
        std::vector<int,_std::allocator<int>_>::vector
                  (&__return_storage_ptr__->hw_chans,&pNVar5->hw_chans);
        return __return_storage_ptr__;
      }
      pNVar5 = pNVar5 + 1;
    } while (pNVar5 != pNVar1);
  }
  NTrodeObj::NTrodeObj(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

NTrodeObj TrodesConfig::getNTrodeByID(const std::string &id) const{
    for(auto const &nt : nTrodes){
        if(nt.getId() == id){
            return nt;
        }
    }
    return NTrodeObj();
}